

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::Texture2DSizeCase::init(Texture2DSizeCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Texture2D *this_00;
  ulong extraout_RAX;
  ulong uVar2;
  ulong extraout_RAX_00;
  uint uVar3;
  long lVar4;
  int levelNdx;
  ulong uVar5;
  ulong uVar6;
  Vec4 local_58;
  Vec4 local_48;
  
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  if (this->m_useMipmaps == true) {
    uVar1 = this->m_height;
    if (this->m_height < this->m_width) {
      uVar1 = this->m_width;
    }
    uVar2 = (ulong)uVar1;
    uVar3 = 0x20;
    if (uVar1 != 0) {
      uVar3 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    uVar6 = (ulong)(0x20 - uVar3);
  }
  else {
    uVar6 = 1;
    uVar2 = extraout_RAX;
  }
  lVar4 = 0;
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,(int)uVar5);
    local_48.m_data[0] = -1.0;
    local_48.m_data[1] = -1.0;
    local_48.m_data[2] = -1.0;
    local_48.m_data[3] = 2.0;
    local_58.m_data[0] = 1.0;
    local_58.m_data[1] = 1.0;
    local_58.m_data[2] = 1.0;
    local_58.m_data[3] = 0.0;
    tcu::fillWithComponentGradients
              ((PixelBufferAccess *)
               ((long)(((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                      m_size.m_data + lVar4 + -8),&local_48,&local_58);
    lVar4 = lVar4 + 0x28;
    uVar2 = extraout_RAX_00;
  }
  return (int)uVar2;
}

Assistant:

void Texture2DSizeCase::init (void)
{
	DE_ASSERT(!m_texture);
	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = m_useMipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;

	// Fill levels.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(levelNdx), tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
	}
}